

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_attachment_reference_stencil_layout
          (Impl *this,Value *state,VkAttachmentReferenceStencilLayout **out_info)

{
  VkImageLayout VVar1;
  VkAttachmentReferenceStencilLayout *pVVar2;
  Type this_00;
  VkAttachmentReferenceStencilLayout *info;
  VkAttachmentReferenceStencilLayout **out_info_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar2 = ScratchAllocator::allocate_cleared<VkAttachmentReferenceStencilLayout>(&this->allocator);
  *out_info = pVVar2;
  this_00 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>
                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)state,"stencilLayout");
  VVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(this_00);
  pVVar2->stencilLayout = VVar1;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_attachment_reference_stencil_layout(const Value &state,
                                                                    VkAttachmentReferenceStencilLayout **out_info)
{
	auto *info = allocator.allocate_cleared<VkAttachmentReferenceStencilLayout>();
	*out_info = info;

	info->stencilLayout = static_cast<VkImageLayout>(state["stencilLayout"].GetUint());
	return true;
}